

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_mbs(archive_mstring *aes,char *mbs)

{
  archive_mstring *in_RSI;
  size_t in_RDI;
  archive_mstring *aes_00;
  undefined4 local_4;
  
  if (in_RSI == (archive_mstring *)0x0) {
    *(undefined4 *)(in_RDI + 0x60) = 0;
    local_4 = L'\0';
  }
  else {
    aes_00 = in_RSI;
    strlen((char *)in_RSI);
    local_4 = archive_mstring_copy_mbs_len(aes_00,(char *)in_RSI,in_RDI);
  }
  return local_4;
}

Assistant:

int
archive_mstring_copy_mbs(struct archive_mstring *aes, const char *mbs)
{
	if (mbs == NULL) {
		aes->aes_set = 0;
		return (0);
	}
	return (archive_mstring_copy_mbs_len(aes, mbs, strlen(mbs)));
}